

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

int av1_get_rdmult_delta(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,int orig_rdmult)

{
  byte bVar1;
  byte right_shift;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  AV1_PRIMARY *pAVar6;
  TplDepFrame *pTVar7;
  TplDepStats *pTVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  undefined7 in_register_00000031;
  long lVar15;
  int col;
  int mi_col_00;
  double beta;
  
  pAVar6 = cpi->ppi;
  bVar1 = cpi->gf_frame_index;
  right_shift = (pAVar6->tpl_data).tpl_stats_block_mis_log2;
  uVar13 = CONCAT71(in_register_00000031,bsize) & 0xffffffff;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar13];
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar13];
  pTVar7 = (pAVar6->tpl_data).tpl_frame;
  pTVar8 = pTVar7[bVar1].tpl_stats_ptr;
  iVar11 = pTVar7[bVar1].stride;
  iVar9 = av1_tpl_stats_ready(&pAVar6->tpl_data,(uint)bVar1);
  if (((iVar9 != 0) && (bVar4 = (pAVar6->gf_group).update_type[cpi->gf_frame_index], bVar4 < 4)) &&
     (bVar4 != 1)) {
    bVar4 = (cpi->common).superres_scale_denominator;
    iVar5 = (cpi->common).superres_upscaled_width;
    iVar9 = (uint)bVar3 + mi_row;
    lVar12 = 0;
    lVar15 = 0;
    for (; mi_col_00 = (int)((uint)bVar4 * mi_col + 4) / 8, mi_row < iVar9;
        mi_row = mi_row + (1 << (right_shift & 0x1f))) {
      for (; mi_col_00 < (int)(((uint)bVar2 + mi_col) * (uint)bVar4 + 4) / 8;
          mi_col_00 = mi_col_00 + (int)(((uint)bVar4 << (right_shift & 0x1f)) + 4) / 8) {
        if ((mi_row < (cpi->common).mi_params.mi_rows) &&
           (mi_col_00 < (int)(iVar5 + 7 >> 2 & 0xfffffffeU))) {
          iVar10 = av1_tpl_ptr_pos(mi_row,mi_col_00,iVar11,right_shift);
          lVar14 = pTVar8[iVar10].recrf_dist * 0x80;
          lVar15 = lVar15 + lVar14;
          lVar12 = pTVar8[iVar10].mc_dep_dist * 0x80 + lVar12 + lVar14 +
                   ((long)pTVar7[bVar1].base_rdmult * pTVar8[iVar10].mc_dep_rate + 0x100 >> 9);
        }
      }
    }
    beta = 1.0;
    if ((0 < lVar12) && (0 < lVar15)) {
      beta = (cpi->rd).r0 / ((double)lVar15 / (double)lVar12);
    }
    iVar9 = av1_get_adaptive_rdmult(cpi,beta);
    iVar11 = (orig_rdmult * 3) / 2;
    if (iVar9 < iVar11) {
      iVar11 = iVar9;
    }
    orig_rdmult = orig_rdmult / 2;
    if (orig_rdmult < iVar11) {
      orig_rdmult = iVar11;
    }
    if (orig_rdmult < 2) {
      orig_rdmult = 1;
    }
  }
  return orig_rdmult;
}

Assistant:

int av1_get_rdmult_delta(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                         int mi_col, int orig_rdmult) {
  AV1_COMMON *const cm = &cpi->common;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  int64_t intra_cost = 0;
  int64_t mc_dep_cost = 0;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, cpi->gf_frame_index)) {
    return orig_rdmult;
  }
  if (!is_frame_tpl_eligible(gf_group, cpi->gf_frame_index)) {
    return orig_rdmult;
  }

#ifndef NDEBUG
  int mi_count = 0;
#endif
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);
  const int step = 1 << block_mis_log2;
  const int row_step = step;
  const int col_step_sr =
      coded_to_superres_mi(step, cm->superres_scale_denominator);
  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) continue;
      TplDepStats *this_stats =
          &tpl_stats[av1_tpl_ptr_pos(row, col, tpl_stride, block_mis_log2)];
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      intra_cost += this_stats->recrf_dist << RDDIV_BITS;
      mc_dep_cost += (this_stats->recrf_dist << RDDIV_BITS) + mc_dep_delta;
#ifndef NDEBUG
      mi_count++;
#endif
    }
  }
  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);

  double beta = 1.0;
  if (mc_dep_cost > 0 && intra_cost > 0) {
    const double r0 = cpi->rd.r0;
    const double rk = (double)intra_cost / mc_dep_cost;
    beta = (r0 / rk);
  }

  int rdmult = av1_get_adaptive_rdmult(cpi, beta);

  rdmult = AOMMIN(rdmult, orig_rdmult * 3 / 2);
  rdmult = AOMMAX(rdmult, orig_rdmult * 1 / 2);

  rdmult = AOMMAX(1, rdmult);

  return rdmult;
}